

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBGray(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  code *pcVar6;
  bool bVar7;
  
  iVar3 = -1;
  iVar4 = -1;
  if ((((-1 < (dst_y | dst_x)) && (iVar4 = iVar3, dst_argb != (uint8_t *)0x0)) && (0 < width)) &&
     (0 < height)) {
    bVar7 = width * 4 != dst_stride_argb;
    iVar4 = 0;
    if (bVar7) {
      iVar4 = dst_stride_argb;
    }
    iVar3 = 1;
    if (!bVar7) {
      iVar3 = height;
    }
    if (!bVar7) {
      height = 1;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    pcVar2 = ARGBGrayRow_C;
    if ((iVar3 * width & 7U) == 0) {
      pcVar2 = ARGBGrayRow_SSSE3;
    }
    puVar5 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
    pcVar6 = ARGBGrayRow_C;
    if ((uVar1 & 0x40) != 0) {
      pcVar6 = pcVar2;
    }
    do {
      (*pcVar6)(puVar5,puVar5,iVar3 * width);
      puVar5 = puVar5 + iVar4;
      height = height + -1;
    } while (height != 0);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

LIBYUV_API
int ARGBGray(uint8_t* dst_argb,
             int dst_stride_argb,
             int dst_x,
             int dst_y,
             int width,
             int height) {
  int y;
  void (*ARGBGrayRow)(const uint8_t* src_argb, uint8_t* dst_argb, int width) =
      ARGBGrayRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBGRAYROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBGRAYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_NEON;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBGrayRow = ARGBGrayRow_MMI;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_MSA;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBGrayRow(dst, dst, width);
    dst += dst_stride_argb;
  }
  return 0;
}